

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt_mimepost
                   (CURL *curl,GlobalConfig *config,char *name,CURLoption tag,curl_mime *mimepost)

{
  uint local_38;
  CURLcode local_34;
  int mimeno;
  CURLcode ret;
  curl_mime *mimepost_local;
  char *pcStack_20;
  CURLoption tag_local;
  char *name_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  _mimeno = mimepost;
  mimepost_local._4_4_ = tag;
  pcStack_20 = name;
  name_local = (char *)config;
  config_local = (GlobalConfig *)curl;
  local_34 = curl_easy_setopt(curl,tag,mimepost);
  local_38 = 0;
  if (((local_34 == CURLE_OK) && (*(long *)(name_local + 0x10) != 0)) &&
     (local_34 = libcurl_generate_mime
                           (config_local,(GlobalConfig *)name_local,
                            *(tool_mime **)(*(long *)(name_local + 0x40) + 800),(int *)&local_38),
     local_34 == CURLE_OK)) {
    local_34 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, mime%d);",pcStack_20,
                            (ulong)local_38);
  }
  return local_34;
}

Assistant:

CURLcode tool_setopt_mimepost(CURL *curl, struct GlobalConfig *config,
                              const char *name, CURLoption tag,
                              curl_mime *mimepost)
{
  CURLcode ret = curl_easy_setopt(curl, tag, mimepost);
  int mimeno = 0;

  if(!ret && config->libcurl) {
    ret = libcurl_generate_mime(curl, config,
                                config->current->mimeroot, &mimeno);

    if(!ret)
      ret = easysrc_addf(&easysrc_code, "curl_easy_setopt(hnd, %s, mime%d);",
                         name, mimeno);
  }

  return ret;
}